

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O1

void __thiscall
QMimeGlobMatchResult::addMatch
          (QMimeGlobMatchResult *this,QString *mimeType,int weight,QString *pattern,
          qsizetype knownSuffixLength)

{
  QStringList *this_00;
  int iVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  CaseSensitivity cs;
  QStringView str;
  QStringView str_00;
  
  cs = (CaseSensitivity)knownSuffixLength;
  this_00 = &this->m_allMatchingMimeTypes;
  str.m_data = (storage_type_conflict *)0x1;
  str.m_size = (qsizetype)(mimeType->d).ptr;
  bVar3 = QtPrivate::QStringList_contains
                    ((QtPrivate *)this_00,(QStringList *)(mimeType->d).size,str,cs);
  if (!bVar3) {
    iVar1 = this->m_weight;
    if (weight < iVar1) {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)this_00,(this->m_allMatchingMimeTypes).d.size,mimeType
                );
      QList<QString>::end(this_00);
      return;
    }
    bVar3 = iVar1 < weight;
    if (weight <= iVar1) {
      lVar2 = (pattern->d).size;
      if (lVar2 < this->m_matchingPatternLength) {
        return;
      }
      bVar3 = this->m_matchingPatternLength < lVar2;
    }
    if (bVar3) {
      QList<QString>::clear(&this->m_matchingMimeTypes);
      this->m_matchingPatternLength = (pattern->d).size;
      this->m_weight = weight;
    }
    str_00.m_data = (storage_type_conflict *)0x1;
    str_00.m_size = (qsizetype)(mimeType->d).ptr;
    bVar4 = QtPrivate::QStringList_contains
                      ((QtPrivate *)this,(QStringList *)(mimeType->d).size,str_00,cs);
    if (!bVar4) {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)this,(this->m_matchingMimeTypes).d.size,mimeType);
      QList<QString>::end(&this->m_matchingMimeTypes);
      if (bVar3) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,0,mimeType);
      }
      else {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,(this->m_allMatchingMimeTypes).d.size,
                   mimeType);
        QList<QString>::end(this_00);
      }
      this->m_knownSuffixLength = knownSuffixLength;
    }
  }
  return;
}

Assistant:

void QMimeGlobMatchResult::addMatch(const QString &mimeType, int weight, const QString &pattern,
                                    qsizetype knownSuffixLength)
{
    if (m_allMatchingMimeTypes.contains(mimeType))
        return;
    // Is this a lower-weight pattern than the last match? Skip this match then.
    if (weight < m_weight) {
        m_allMatchingMimeTypes.append(mimeType);
        return;
    }
    bool replace = weight > m_weight;
    if (!replace) {
        // Compare the length of the match
        if (pattern.size() < m_matchingPatternLength)
            return; // too short, ignore
        else if (pattern.size() > m_matchingPatternLength) {
            // longer: clear any previous match (like *.bz2, when pattern is *.tar.bz2)
            replace = true;
        }
    }
    if (replace) {
        m_matchingMimeTypes.clear();
        // remember the new "longer" length
        m_matchingPatternLength = pattern.size();
        m_weight = weight;
    }
    if (!m_matchingMimeTypes.contains(mimeType)) {
        m_matchingMimeTypes.append(mimeType);
        if (replace)
            m_allMatchingMimeTypes.prepend(mimeType); // highest-weight first
        else
            m_allMatchingMimeTypes.append(mimeType);
        m_knownSuffixLength = knownSuffixLength;
    }
}